

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O2

void __thiscall SQCompilation::CodegenVisitor::visitDeclGroup(CodegenVisitor *this,DeclGroup *group)

{
  uint uVar1;
  VarDecl **ppVVar2;
  long lVar3;
  
  addLineNumber(this,(Statement *)group);
  ppVVar2 = (group->_decls)._vals;
  uVar1 = (group->_decls)._size;
  for (lVar3 = 0; (ulong)uVar1 << 3 != lVar3; lVar3 = lVar3 + 8) {
    Node::visit<SQCompilation::CodegenVisitor>(*(Node **)((long)ppVVar2 + lVar3),this);
  }
  return;
}

Assistant:

void CodegenVisitor::visitDeclGroup(DeclGroup *group) {
    addLineNumber(group);
    const auto &declarations = group->declarations();

    for (Decl *d : declarations) {
        d->visit(this);
    }
}